

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O3

LY_ERR lys_check_features(lysp_module *pmod)

{
  lysc_iffeature *iff;
  LY_ERR LVar1;
  lysp_feature *last;
  uint32_t i;
  size_t index_e;
  uint32_t local_44;
  size_t local_40 [2];
  
  local_44 = 0;
  last = lysp_feature_next((lysp_feature *)0x0,pmod,&local_44);
  if (last != (lysp_feature *)0x0) {
    do {
      if (((last->flags & 0x20) != 0) && (last->iffeatures != (lysp_qname *)0x0)) {
        iff = last->iffeatures_c;
        if (iff == (lysc_iffeature *)0x0) {
          __assert_fail("f->iffeatures_c",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_features.c"
                        ,0x229,"LY_ERR lys_check_features(const struct lysp_module *)");
        }
        local_40[1] = 0;
        local_40[0] = 0;
        if (iff->expr == (uint8_t *)0x0) {
LAB_00153e67:
          ly_log(pmod->mod->ctx,LY_LLERR,LY_EDENIED,
                 "Feature \"%s\" cannot be enabled because its \"if-feature\" is not satisfied.",
                 last->name);
          return LY_EDENIED;
        }
        LVar1 = lysc_iffeature_value_(iff,local_40 + 1,local_40);
        if (LVar1 != LY_SUCCESS) {
          if (LVar1 != LY_ENOT) {
            return LVar1;
          }
          goto LAB_00153e67;
        }
      }
      last = lysp_feature_next(last,pmod,&local_44);
    } while (last != (lysp_feature *)0x0);
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lys_check_features(const struct lysp_module *pmod)
{
    LY_ERR r;
    uint32_t i = 0;
    struct lysp_feature *f = NULL;

    while ((f = lysp_feature_next(f, pmod, &i))) {
        if (!(f->flags & LYS_FENABLED) || !f->iffeatures) {
            /* disabled feature or no if-features to check */
            continue;
        }

        assert(f->iffeatures_c);
        r = lysc_iffeature_value(f->iffeatures_c);
        if (r == LY_ENOT) {
            LOGERR(pmod->mod->ctx, LY_EDENIED, "Feature \"%s\" cannot be enabled because its \"if-feature\" is not satisfied.",
                    f->name);
            return LY_EDENIED;
        } else if (r) {
            return r;
        } /* else if-feature satisfied */
    }

    return LY_SUCCESS;
}